

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::resize
          (PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *this,Index rows,Index cols)

{
  bool bVar1;
  Index cols_local;
  Index rows_local;
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *this_local;
  bool error;
  long max_index;
  
  bVar1 = false;
  if ((-1 < rows) && (bVar1 = false, -1 < cols)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1, 1, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1, 1, -1, -1>]"
                 );
  }
  if ((rows == 0) || (cols == 0)) {
    bVar1 = false;
  }
  else {
    bVar1 = 0x7fffffffffffffff / cols < rows;
  }
  if (bVar1) {
    internal::throw_std_bad_alloc();
  }
  DenseStorage<float,_-1,_-1,_-1,_1>::resize(&this->m_storage,rows * cols,rows,cols);
  return;
}

Assistant:

void resize(Index rows, Index cols)
    {
      eigen_assert(   EIGEN_IMPLIES(RowsAtCompileTime!=Dynamic,rows==RowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime!=Dynamic,cols==ColsAtCompileTime)
                   && EIGEN_IMPLIES(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic,rows<=MaxRowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic,cols<=MaxColsAtCompileTime)
                   && rows>=0 && cols>=0 && "Invalid sizes when resizing a matrix or array.");
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(rows, cols);
      #ifdef EIGEN_INITIALIZE_COEFFS
        Index size = rows*cols;
        bool size_changed = size != this->size();
        m_storage.resize(size, rows, cols);
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #else
        m_storage.resize(rows*cols, rows, cols);
      #endif
    }